

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

_Bool roaring_bitmap_is_subset(roaring_bitmap_t *r1,roaring_bitmap_t *r2)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  uint16_t *puVar4;
  byte bVar5;
  _Bool _Var6;
  byte bVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  array_container_t *container2;
  array_container_t *container1;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  
  uVar2 = (r1->high_low_container).size;
  uVar3 = (r2->high_low_container).size;
  uVar13 = 0;
  uVar12 = 0;
  do {
    if (((int)uVar2 <= (int)uVar12) || ((int)uVar3 <= (int)uVar13)) {
      return uVar12 == uVar2;
    }
    uVar8 = uVar12 & 0xffff;
    uVar1 = (r1->high_low_container).keys[uVar8];
    puVar4 = (r2->high_low_container).keys;
    uVar11 = uVar13 & 0xffff;
    if (uVar1 == puVar4[uVar11]) {
      bVar5 = (r1->high_low_container).typecodes[uVar8];
      container1 = (array_container_t *)(r1->high_low_container).containers[uVar8];
      bVar7 = (r2->high_low_container).typecodes[uVar11];
      container2 = (array_container_t *)(r2->high_low_container).containers[uVar11];
      if (bVar5 == 4) {
        bVar5 = *(byte *)&container1->array;
        if (bVar5 == 4) goto LAB_0011b506;
        container1 = *(array_container_t **)container1;
      }
      if (bVar7 == 4) {
        bVar7 = *(byte *)&container2->array;
        if (bVar7 == 4) {
LAB_0011b506:
          __assert_fail("*type != SHARED_CONTAINER_TYPE",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                        ,0x1062,
                        "const container_t *container_unwrap_shared(const container_t *, uint8_t *)"
                       );
        }
        container2 = *(array_container_t **)container2;
      }
      switch((uint)bVar7 + (uint)bVar5 * 4) {
      case 5:
        _Var6 = bitset_container_is_subset
                          ((bitset_container_t *)container1,(bitset_container_t *)container2);
        break;
      case 6:
        _Var6 = false;
        break;
      case 7:
        _Var6 = bitset_container_is_subset_run
                          ((bitset_container_t *)container1,(run_container_t *)container2);
        break;
      default:
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x12d5,
                      "_Bool container_is_subset(const container_t *, uint8_t, const container_t *, uint8_t)"
                     );
      case 9:
        _Var6 = array_container_is_subset_bitset(container1,(bitset_container_t *)container2);
        break;
      case 10:
        _Var6 = array_container_is_subset(container1,container2);
        break;
      case 0xb:
        _Var6 = array_container_is_subset_run(container1,(run_container_t *)container2);
        break;
      case 0xd:
        _Var6 = run_container_is_subset_bitset
                          ((run_container_t *)container1,(bitset_container_t *)container2);
        break;
      case 0xe:
        _Var6 = run_container_is_subset_array((run_container_t *)container1,container2);
        break;
      case 0xf:
        _Var6 = run_container_is_subset((run_container_t *)container1,(run_container_t *)container2)
        ;
      }
      uVar12 = uVar12 + _Var6;
      uVar11 = uVar13 + _Var6;
    }
    else if (uVar1 < puVar4[uVar11]) {
      _Var6 = false;
      uVar11 = uVar13;
    }
    else {
      uVar8 = uVar13 + 1;
      _Var6 = true;
      uVar11 = uVar8;
      if (((int)uVar8 < (int)uVar3) && (puVar4[(int)uVar8] < uVar1)) {
        uVar13 = uVar13 + 2;
        iVar10 = 0;
        uVar14 = uVar3 - 1;
        if ((int)uVar13 < (int)uVar3) {
          iVar9 = 1;
          do {
            uVar14 = uVar13;
            iVar10 = iVar9;
            if (uVar1 <= puVar4[(int)uVar13]) break;
            iVar10 = iVar9 * 2;
            uVar13 = uVar8 + iVar9 * 2;
            uVar14 = uVar3 - 1;
            iVar9 = iVar10;
          } while ((int)uVar13 < (int)uVar3);
          iVar10 = iVar10 >> 1;
        }
        uVar11 = uVar14;
        if (((puVar4[(int)uVar14] != uVar1) && (uVar11 = uVar3, uVar1 <= puVar4[(int)uVar14])) &&
           (uVar11 = uVar14, iVar10 + uVar8 + 1 != uVar14)) {
          uVar8 = iVar10 + uVar8;
          do {
            uVar11 = (int)(uVar8 + uVar14) >> 1;
            if (puVar4[(int)uVar11] == uVar1) break;
            uVar13 = uVar11;
            if (uVar1 <= puVar4[(int)uVar11]) {
              uVar13 = uVar8;
              uVar14 = uVar11;
            }
            uVar8 = uVar13;
            uVar11 = uVar14;
          } while (uVar8 + 1 != uVar14);
        }
      }
    }
    uVar13 = uVar11;
    if (_Var6 == false) {
      return false;
    }
  } while( true );
}

Assistant:

bool roaring_bitmap_is_subset(const roaring_bitmap_t *r1,
                              const roaring_bitmap_t *r2) {
    const roaring_array_t *ra1 = &r1->high_low_container;
    const roaring_array_t *ra2 = &r2->high_low_container;

    const int length1 = ra1->size,
              length2 = ra2->size;

    int pos1 = 0, pos2 = 0;

    while (pos1 < length1 && pos2 < length2) {
        const uint16_t s1 = ra_get_key_at_index(ra1, pos1);
        const uint16_t s2 = ra_get_key_at_index(ra2, pos2);

        if (s1 == s2) {
            uint8_t type1, type2;
            container_t *c1 = ra_get_container_at_index(ra1, pos1, &type1);
            container_t *c2 = ra_get_container_at_index(ra2, pos2, &type2);
            if (!container_is_subset(c1, type1, c2, type2))
                return false;
            ++pos1;
            ++pos2;
        } else if (s1 < s2) {  // s1 < s2
            return false;
        } else {  // s1 > s2
            pos2 = ra_advance_until(ra2, s1, pos2);
        }
    }
    if (pos1 == length1)
        return true;
    else
        return false;
}